

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryCEscape
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          ArrayPtr<const_char> text,bool nulTerminate)

{
  kj kVar1;
  RemoveConst<unsigned_char> *pRVar2;
  char *pcVar3;
  kj *pkVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  kj *pkVar12;
  short sVar13;
  int iVar14;
  byte bVar15;
  char *ptrCopy;
  ulong uVar16;
  bool bVar17;
  char *pcVar18;
  char *pcVar19;
  ArrayPtr<const_char32_t> utf16;
  ArrayPtr<const_char16_t> utf16_00;
  EncodingResult<kj::String> utf;
  Vector<unsigned_char> local_98;
  char *local_78;
  undefined4 local_6c;
  ulong local_68;
  uint local_5c;
  EncodingResult<kj::String> local_58;
  EncodingResult<kj::Array<unsigned_char>_> *local_38;
  
  pcVar8 = text.ptr;
  local_5c = (uint)text.size_;
  uVar16 = (ulong)local_5c;
  local_98.builder.ptr =
       (uchar *)_::HeapArrayDisposer::allocateImpl
                          (1,0,(size_t)(pcVar8 + uVar16),(_func_void_void_ptr *)0x0,
                           (_func_void_void_ptr *)0x0);
  local_98.builder.endPtr = (uchar *)(pcVar8 + uVar16 + (long)local_98.builder.ptr);
  local_98.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_98.builder.pos = local_98.builder.ptr;
  if (pcVar8 == (char *)0x0) {
    bVar17 = false;
  }
  else {
    uVar16 = 0;
    pcVar19 = (char *)0x0;
    local_38 = __return_storage_ptr__;
    do {
      pcVar18 = pcVar19 + 1;
      kVar1 = this[(long)pcVar19];
      if (kVar1 != (kj)0x5c) {
        if (local_98.builder.pos == local_98.builder.endPtr) {
          sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
          if (local_98.builder.pos == local_98.builder.ptr) {
            sVar11 = 4;
          }
          Vector<unsigned_char>::setCapacity(&local_98,sVar11);
        }
        *local_98.builder.pos = (RemoveConst<unsigned_char>)kVar1;
        goto LAB_001b6502;
      }
      if (pcVar18 == pcVar8) {
        bVar15 = 1;
        break;
      }
      pcVar18 = pcVar19 + 2;
      kVar1 = (this + 1)[(long)pcVar19];
      if ((byte)kVar1 < 0x55) {
        uVar9 = (byte)kVar1 - 0x30;
        if (uVar9 < 8) {
          if (pcVar18 < pcVar8) {
            bVar15 = 1;
            do {
              pkVar4 = this + (long)pcVar18;
              if (((byte)*pkVar4 & 0xf8) != 0x30) break;
              pcVar18 = pcVar18 + 1;
              uVar9 = ((uint)(byte)*pkVar4 + uVar9 * 8) - 0x30;
              bVar17 = (bool)(bVar15 & pcVar18 < pcVar8);
              bVar15 = 0;
            } while (bVar17);
          }
          uVar16 = uVar16 & 0xff;
          if (0xff < uVar9) {
            uVar16 = 1;
          }
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = (RemoveConst<unsigned_char>)SUB41(uVar9,0);
        }
        else if (kVar1 == (kj)0x22) {
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = '\"';
        }
        else {
          if (kVar1 != (kj)0x27) goto switchD_001b640c_caseD_6f;
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = '\'';
        }
        goto LAB_001b6502;
      }
      if ((byte)kVar1 < 0x62) {
        if (kVar1 != (kj)0x55) {
          if (kVar1 == (kj)0x5c) {
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.pos == local_98.builder.ptr) {
                sVar11 = 4;
              }
              Vector<unsigned_char>::setCapacity(&local_98,sVar11);
            }
            *local_98.builder.pos = '\\';
          }
          else {
            if (kVar1 != (kj)0x61) goto switchD_001b640c_caseD_6f;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.pos == local_98.builder.ptr) {
                sVar11 = 4;
              }
              Vector<unsigned_char>::setCapacity(&local_98,sVar11);
            }
            *local_98.builder.pos = '\a';
          }
          goto LAB_001b6502;
        }
        pcVar3 = pcVar19 + 10;
        uVar5 = 0;
        iVar7 = 8;
        do {
          uVar10 = 1;
          pcVar19 = pcVar8;
          if (pcVar8 == pcVar18) goto LAB_001b68bb;
          kVar1 = this[(long)pcVar18];
          iVar14 = -0x30;
          if (((9 < (byte)((char)kVar1 - 0x30U)) &&
              (iVar14 = -0x57, 5 < (byte)((char)kVar1 + 0x9fU))) &&
             (iVar14 = -0x37, pcVar19 = pcVar18, 5 < (byte)((char)kVar1 + 0xbfU)))
          goto LAB_001b68bb;
          pcVar18 = pcVar18 + 1;
          uVar5 = (ulong)(uint)((int)uVar5 << 4 | iVar14 + (char)kVar1);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        uVar10 = uVar16 & 0xffffffff;
        pcVar19 = pcVar3;
LAB_001b68bb:
        local_6c = (undefined4)uVar5;
        utf16.size_ = uVar5;
        utf16.ptr = (char32_t *)0x1;
        decodeUtf32(&local_58,(kj *)&local_6c,utf16);
        pcVar18 = local_58.super_String.content.ptr;
        local_68 = uVar10 & 0xff;
        if (local_58.hadErrors != false) {
          local_68 = 1;
        }
        pcVar3 = (char *)0x0;
        if ((char *)local_58.super_String.content.size_ != (char *)0x0) {
          pcVar3 = (char *)(local_58.super_String.content.size_ + -1);
        }
        pkVar4 = (kj *)(pcVar3 + ((long)local_98.builder.pos - (long)local_98.builder.ptr));
        pcVar6 = (char *)local_58.super_String.content.size_;
        if ((kj *)(local_98.builder.endPtr + -(long)local_98.builder.ptr) < pkVar4) {
          local_78 = (char *)local_58.super_String.content.size_;
          pkVar12 = (kj *)((long)(local_98.builder.endPtr + -(long)local_98.builder.ptr) * 2);
          if (local_98.builder.endPtr == local_98.builder.ptr) {
            pkVar12 = (kj *)0x4;
          }
          if (pkVar12 < pkVar4) {
            pkVar12 = pkVar4;
          }
          Vector<unsigned_char>::setCapacity(&local_98,(size_t)pkVar12);
          pcVar6 = local_78;
        }
        pRVar2 = local_98.builder.pos;
        if ((char *)0x1 < pcVar6) {
          local_78 = pcVar18;
          memcpy(local_98.builder.pos,pcVar18,(size_t)pcVar3);
          local_98.builder.pos = pRVar2 + (long)pcVar3;
          pcVar18 = local_78;
        }
        uVar16 = local_68;
        if (pcVar18 != (char *)0x0) {
          local_58.super_String.content.ptr = (char *)0x0;
          local_58.super_String.content.size_ = 0;
          (*(code *)**(undefined8 **)local_58.super_String.content.disposer)
                    (local_58.super_String.content.disposer,pcVar18,1,pcVar6,pcVar6,0);
          uVar16 = local_68;
        }
      }
      else {
        switch(kVar1) {
        case (kj)0x6e:
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = '\n';
          break;
        case (kj)0x6f:
        case (kj)0x70:
        case (kj)0x71:
        case (kj)0x73:
        case (kj)0x77:
switchD_001b640c_caseD_6f:
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = (RemoveConst<unsigned_char>)kVar1;
          break;
        case (kj)0x72:
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = '\r';
          break;
        case (kj)0x74:
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = '\t';
          break;
        case (kj)0x75:
          pcVar3 = pcVar19 + 6;
          iVar7 = 4;
          uVar5 = 0;
          do {
            uVar10 = 1;
            pcVar19 = pcVar8;
            if (pcVar8 == pcVar18) goto LAB_001b69e8;
            kVar1 = this[(long)pcVar18];
            sVar13 = -0x30;
            if (((9 < (byte)((char)kVar1 - 0x30U)) &&
                (sVar13 = -0x57, 5 < (byte)((char)kVar1 + 0x9fU))) &&
               (sVar13 = -0x37, pcVar19 = pcVar18, 5 < (byte)((char)kVar1 + 0xbfU)))
            goto LAB_001b69e8;
            pcVar18 = pcVar18 + 1;
            uVar5 = (ulong)(uint)((int)uVar5 << 4 | (int)sVar13 + (int)(short)(char)kVar1);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          uVar10 = uVar16 & 0xffffffff;
          pcVar19 = pcVar3;
LAB_001b69e8:
          local_6c = CONCAT22(local_6c._2_2_,(short)uVar5);
          utf16_00.size_ = uVar5;
          utf16_00.ptr = (char16_t *)0x1;
          decodeUtf16(&local_58,(kj *)&local_6c,utf16_00);
          pcVar18 = local_58.super_String.content.ptr;
          local_68 = uVar10 & 0xff;
          if (local_58.hadErrors != false) {
            local_68 = 1;
          }
          pcVar3 = (char *)0x0;
          if ((char *)local_58.super_String.content.size_ != (char *)0x0) {
            pcVar3 = (char *)(local_58.super_String.content.size_ + -1);
          }
          pkVar4 = (kj *)(pcVar3 + ((long)local_98.builder.pos - (long)local_98.builder.ptr));
          pcVar6 = (char *)local_58.super_String.content.size_;
          if ((kj *)(local_98.builder.endPtr + -(long)local_98.builder.ptr) < pkVar4) {
            local_78 = (char *)local_58.super_String.content.size_;
            pkVar12 = (kj *)((long)(local_98.builder.endPtr + -(long)local_98.builder.ptr) * 2);
            if (local_98.builder.endPtr == local_98.builder.ptr) {
              pkVar12 = (kj *)0x4;
            }
            if (pkVar12 < pkVar4) {
              pkVar12 = pkVar4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,(size_t)pkVar12);
            pcVar6 = local_78;
          }
          pRVar2 = local_98.builder.pos;
          if ((char *)0x1 < pcVar6) {
            local_78 = pcVar18;
            memcpy(local_98.builder.pos,pcVar18,(size_t)pcVar3);
            local_98.builder.pos = pRVar2 + (long)pcVar3;
            pcVar18 = local_78;
          }
          uVar16 = local_68;
          if (pcVar18 != (char *)0x0) {
            local_58.super_String.content.ptr = (char *)0x0;
            local_58.super_String.content.size_ = 0;
            (*(code *)**(undefined8 **)local_58.super_String.content.disposer)
                      (local_58.super_String.content.disposer,pcVar18,1,pcVar6,pcVar6);
            uVar16 = local_68;
          }
          goto LAB_001b6507;
        case (kj)0x76:
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = '\v';
          break;
        case (kj)0x78:
          uVar9 = 0;
          pcVar19 = pcVar18;
          if (pcVar18 < pcVar8) {
            do {
              kVar1 = this[(long)pcVar19];
              iVar7 = -0x30;
              if (((9 < (byte)((char)kVar1 - 0x30U)) &&
                  (iVar7 = -0x57, 5 < (byte)((char)kVar1 + 0x9fU))) &&
                 (iVar7 = -0x37, pcVar18 = pcVar19, 5 < (byte)((char)kVar1 + 0xbfU))) break;
              pcVar19 = pcVar19 + 1;
              uVar9 = uVar9 << 4 | iVar7 + (char)kVar1;
              pcVar18 = pcVar8;
            } while (pcVar8 != pcVar19);
            uVar16 = uVar16 & 0xff;
            if (0xff < uVar9) {
              uVar16 = 1;
            }
          }
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar11 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_98,sVar11);
          }
          *local_98.builder.pos = (RemoveConst<unsigned_char>)SUB41(uVar9,0);
          break;
        default:
          if (kVar1 == (kj)0x62) {
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.pos == local_98.builder.ptr) {
                sVar11 = 4;
              }
              Vector<unsigned_char>::setCapacity(&local_98,sVar11);
            }
            *local_98.builder.pos = '\b';
          }
          else {
            if (kVar1 != (kj)0x66) goto switchD_001b640c_caseD_6f;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar11 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.pos == local_98.builder.ptr) {
                sVar11 = 4;
              }
              Vector<unsigned_char>::setCapacity(&local_98,sVar11);
            }
            *local_98.builder.pos = '\f';
          }
        }
LAB_001b6502:
        local_98.builder.pos = local_98.builder.pos + 1;
        pcVar19 = pcVar18;
      }
LAB_001b6507:
      bVar15 = (byte)uVar16;
    } while (pcVar19 < pcVar8);
    bVar17 = (bool)(bVar15 & 1);
    __return_storage_ptr__ = local_38;
  }
  if ((char)local_5c != '\0') {
    if (local_98.builder.pos == local_98.builder.endPtr) {
      sVar11 = 4;
      if (local_98.builder.endPtr != local_98.builder.ptr) {
        sVar11 = ((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2;
      }
      Vector<unsigned_char>::setCapacity(&local_98,sVar11);
    }
    *local_98.builder.pos = '\0';
    local_98.builder.pos = local_98.builder.pos + 1;
  }
  if (local_98.builder.pos != local_98.builder.endPtr) {
    Vector<unsigned_char>::setCapacity
              (&local_98,(long)local_98.builder.pos - (long)local_98.builder.ptr);
    local_98.builder.endPtr = local_98.builder.pos;
  }
  (__return_storage_ptr__->super_Array<unsigned_char>).ptr = local_98.builder.ptr;
  (__return_storage_ptr__->super_Array<unsigned_char>).size_ =
       (long)local_98.builder.endPtr - (long)local_98.builder.ptr;
  (__return_storage_ptr__->super_Array<unsigned_char>).disposer = local_98.builder.disposer;
  __return_storage_ptr__->hadErrors = bVar17;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryCEscape(ArrayPtr<const char> text, bool nulTerminate) {
  Vector<byte> result(text.size() + nulTerminate);
  bool hadErrors = false;

  size_t i = 0;
  while (i < text.size()) {
    char c = text[i++];
    if (c == '\\') {
      if (i == text.size()) {
        hadErrors = true;
        continue;
      }
      char c2 = text[i++];
      switch (c2) {
        case 'a' : result.add('\a'); break;
        case 'b' : result.add('\b'); break;
        case 'f' : result.add('\f'); break;
        case 'n' : result.add('\n'); break;
        case 'r' : result.add('\r'); break;
        case 't' : result.add('\t'); break;
        case 'v' : result.add('\v'); break;
        case '\'': result.add('\''); break;
        case '\"': result.add('\"'); break;
        case '\\': result.add('\\'); break;

        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7': {
          uint value = c2 - '0';
          for (uint j = 0; j < 2 && i < text.size(); j++) {
            KJ_IF_SOME(d, tryFromOctDigit(text[i])) {
              ++i;
              value = (value << 3) | d;
            } else {
              break;
            }
          }
          if (value >= 0x100) hadErrors = true;
          result.add(value);
          break;
        }

        case 'x': {
          uint value = 0;
          while (i < text.size()) {
            KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              break;
            }
          }
          if (value >= 0x100) hadErrors = true;
          result.add(value);
          break;
        }

        case 'u': {
          char16_t value = 0;
          for (uint j = 0; j < 4; j++) {
            if (i == text.size()) {
              hadErrors = true;
              break;
            } else KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              hadErrors = true;
              break;
            }
          }
          auto utf = decodeUtf16(arrayPtr(&value, 1));
          if (utf.hadErrors) hadErrors = true;
          result.addAll(utf.asBytes());
          break;
        }

        case 'U': {
          char32_t value = 0;
          for (uint j = 0; j < 8; j++) {
            if (i == text.size()) {
              hadErrors = true;
              break;
            } else KJ_IF_SOME(d, tryFromHexDigit(text[i])) {
              ++i;
              value = (value << 4) | d;
            } else {
              hadErrors = true;
              break;
            }
          }
          auto utf = decodeUtf32(arrayPtr(&value, 1));
          if (utf.hadErrors) hadErrors = true;
          result.addAll(utf.asBytes());
          break;
        }